

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushStyleVar(ImGuiStyleVar idx,ImVec2 *val)

{
  int *piVar1;
  anon_union_8_2_f211c874_for_ImGuiStyleMod_1 aVar2;
  uint uVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  ImGuiStyleMod *__dest;
  ImGuiContext *pIVar6;
  int iVar7;
  ImGuiStyleMod *pIVar8;
  int iVar9;
  
  pIVar4 = GImGui;
  if (0xb < (uint)idx) {
    __assert_fail("idx >= 0 && idx < ImGuiStyleVar_Count_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x1259,"const ImGuiStyleVarInfo *GetStyleVarInfo(ImGuiStyleVar)");
  }
  if (GStyleVarInfo[(uint)idx].Type != ImGuiDataType_Float2) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0x1274,"void ImGui::PushStyleVar(ImGuiStyleVar, const ImVec2 &)");
  }
  uVar3 = GStyleVarInfo[(uint)idx].Offset;
  aVar2 = *(anon_union_8_2_f211c874_for_ImGuiStyleMod_1 *)
           ((long)&((ImGuiStyle *)((GImGui->Style).Colors + -8))->Alpha + (ulong)uVar3);
  iVar5 = (GImGui->StyleModifiers).Size;
  if (iVar5 != (GImGui->StyleModifiers).Capacity) {
    __dest = (GImGui->StyleModifiers).Data;
    goto LAB_0013a110;
  }
  if (iVar5 == 0) {
    iVar7 = 8;
  }
  else {
    iVar7 = iVar5 / 2 + iVar5;
  }
  iVar9 = iVar5 + 1;
  if (iVar5 + 1 < iVar7) {
    iVar9 = iVar7;
  }
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  __dest = (ImGuiStyleMod *)(*(pIVar4->IO).MemAllocFn)((long)iVar9 * 0xc);
  pIVar8 = (pIVar4->StyleModifiers).Data;
  if (pIVar8 == (ImGuiStyleMod *)0x0) {
LAB_0013a0ef:
    pIVar8 = (ImGuiStyleMod *)0x0;
    pIVar6 = GImGui;
  }
  else {
    memcpy(__dest,pIVar8,(long)(pIVar4->StyleModifiers).Size * 0xc);
    pIVar6 = GImGui;
    pIVar8 = (pIVar4->StyleModifiers).Data;
    if (pIVar8 == (ImGuiStyleMod *)0x0) goto LAB_0013a0ef;
    piVar1 = &(GImGui->IO).MetricsAllocs;
    *piVar1 = *piVar1 + -1;
  }
  (*(pIVar6->IO).MemFreeFn)(pIVar8);
  (pIVar4->StyleModifiers).Data = __dest;
  (pIVar4->StyleModifiers).Capacity = iVar9;
  iVar5 = (pIVar4->StyleModifiers).Size;
LAB_0013a110:
  (pIVar4->StyleModifiers).Size = iVar5 + 1;
  __dest[iVar5].VarIdx = idx;
  __dest[iVar5].field_1 = aVar2;
  *(ImVec2 *)((long)&((ImGuiStyle *)((pIVar4->Style).Colors + -8))->Alpha + (ulong)uVar3) = *val;
  return;
}

Assistant:

static const ImGuiStyleVarInfo* GetStyleVarInfo(ImGuiStyleVar idx)
{
    IM_ASSERT(idx >= 0 && idx < ImGuiStyleVar_Count_);
    return &GStyleVarInfo[idx];
}